

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::shadeFragments
          (FlatColorShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  pointer pUVar2;
  GenericVec4 *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 color;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Vec4 local_38;
  
  pUVar2 = (this->super_ShaderProgram).m_uniforms.
           super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.m_data._0_8_ = *(undefined8 *)&pUVar2->value;
  local_38.m_data._8_8_ = *(undefined8 *)((long)&pUVar2->value + 8);
  castVectorSaturate<int>(&local_38);
  castVectorSaturate<unsigned_int>(&local_38);
  iVar4 = *(int *)&(this->super_ShaderProgram).field_0x154;
  if (iVar4 == 4) {
    if (0 < numPackets) {
      pGVar3 = context->outputArray;
      iVar4 = context->numFragmentOutputs;
      iVar5 = 0;
      uVar7 = 0;
      do {
        lVar8 = 4;
        iVar6 = iVar5;
        do {
          *(undefined8 *)&pGVar3[iVar6].v = local_38.m_data._0_8_;
          *(undefined8 *)((long)&pGVar3[iVar6].v + 8) = local_38.m_data._8_8_;
          iVar6 = iVar6 + iVar4;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
        uVar7 = uVar7 + 1;
        iVar5 = iVar5 + iVar4 * 4;
      } while (uVar7 != (uint)numPackets);
    }
  }
  else if (iVar4 == 0x1e) {
    if (0 < numPackets) {
      pGVar3 = context->outputArray;
      iVar4 = 0;
      iVar5 = 0;
      do {
        iVar6 = 0;
        do {
          iVar1 = context->numFragmentOutputs;
          *(undefined8 *)&pGVar3[(iVar4 + iVar6) * iVar1].v = local_48;
          *(undefined8 *)((long)&pGVar3[(iVar4 + iVar6) * iVar1].v + 8) = uStack_40;
          iVar6 = iVar6 + 1;
        } while (iVar6 != 4);
        iVar5 = iVar5 + 1;
        iVar4 = iVar4 + 4;
      } while (iVar5 != numPackets);
    }
  }
  else if ((iVar4 == 0x22) && (0 < numPackets)) {
    pGVar3 = context->outputArray;
    iVar4 = 0;
    iVar5 = 0;
    do {
      iVar6 = 0;
      do {
        iVar1 = context->numFragmentOutputs;
        *(undefined8 *)&pGVar3[(iVar4 + iVar6) * iVar1].v = local_58;
        *(undefined8 *)((long)&pGVar3[(iVar4 + iVar6) * iVar1].v + 8) = uStack_50;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 4);
      iVar5 = iVar5 + 1;
      iVar4 = iVar4 + 4;
    } while (iVar5 != numPackets);
  }
  return;
}

Assistant:

void FlatColorShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4		color	(m_uniforms[0].value.f4);
	const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
	const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

	DE_UNREF(packets);

	if (m_outputType == glu::TYPE_FLOAT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else if (m_outputType == glu::TYPE_INT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
	}
	else if (m_outputType == glu::TYPE_UINT_VEC4)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
	}
	else
		DE_ASSERT(DE_FALSE);
}